

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
* __thiscall
node::anon_unknown_2::NodeImpl::listExternalSigners
          (vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
           *__return_storage_ptr__,NodeImpl *this)

{
  unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_> *__first;
  string chain;
  bool bVar1;
  ArgsManager *this_00;
  CChainParams *this_01;
  ExternalSigner *pEVar2;
  size_type __n;
  pointer __result;
  unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_> *puVar3;
  unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_> *puVar4;
  pointer pEVar5;
  pointer pEVar6;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffea8;
  ExternalSigner *pEVar7;
  undefined8 in_stack_fffffffffffffeb0;
  pointer __last;
  undefined8 in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  vector<ExternalSigner,_std::allocator<ExternalSigner>_> local_138;
  string local_118;
  string local_f8;
  string command;
  ExternalSigner local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
  super__Vector_impl_data._M_start = (ExternalSigner *)0x0;
  local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
  super__Vector_impl_data._M_finish = (ExternalSigner *)0x0;
  local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = args(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"-signer",(allocator<char> *)&stack0xfffffffffffffec7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"",(allocator<char> *)&stack0xfffffffffffffec6);
  ArgsManager::GetArg(&command,this_00,&local_b8.m_command,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  bVar1 = std::operator==(&command,"");
  if (bVar1) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    this_01 = Params();
    CChainParams::GetChainTypeString_abi_cxx11_(&local_118,this_01);
    chain._M_string_length = in_stack_fffffffffffffeb0;
    chain._M_dataplus._M_p = (pointer)in_stack_fffffffffffffea8;
    chain.field_2._M_allocated_capacity = in_stack_fffffffffffffeb8;
    chain.field_2._8_8_ = in_stack_fffffffffffffec0;
    ExternalSigner::Enumerate(&command,&local_138,chain);
    std::__cxx11::string::~string((string *)&local_118);
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
    ::reserve(__return_storage_ptr__,
              (long)local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 7);
    pEVar6 = local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pEVar7 = local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar5 = local_138.super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>.
                  _M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar6; pEVar5 = pEVar5 + 1) {
      pEVar2 = (ExternalSigner *)operator_new(0x88);
      ExternalSigner::ExternalSigner(&local_b8,pEVar5);
      pEVar2->_vptr_ExternalSigner = (_func_int **)&PTR__ExternalSignerImpl_01152360;
      ExternalSigner::ExternalSigner((ExternalSigner *)(pEVar2 + 1),&local_b8);
      ExternalSigner::~ExternalSigner(&local_b8);
      puVar4 = (__return_storage_ptr__->
               super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (puVar4 == (__return_storage_ptr__->
                    super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = std::
              vector<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
              ::_M_check_len(__return_storage_ptr__,1,"vector::_M_realloc_insert");
        __first = (__return_storage_ptr__->
                  super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        __last = (__return_storage_ptr__->
                 super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        __result = std::
                   _Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                   ::_M_allocate(&__return_storage_ptr__->
                                  super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                                 ,__n);
        *(ExternalSigner **)((long)__result + ((long)puVar4 - (long)__first)) = pEVar2;
        puVar3 = std::
                 __relocate_a_1<std::unique_ptr<interfaces::ExternalSigner,std::default_delete<interfaces::ExternalSigner>>*,std::unique_ptr<interfaces::ExternalSigner,std::default_delete<interfaces::ExternalSigner>>*,std::allocator<std::unique_ptr<interfaces::ExternalSigner,std::default_delete<interfaces::ExternalSigner>>>>
                           (__first,puVar4,__result,
                            (allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
                             *)__return_storage_ptr__);
        puVar4 = std::
                 __relocate_a_1<std::unique_ptr<interfaces::ExternalSigner,std::default_delete<interfaces::ExternalSigner>>*,std::unique_ptr<interfaces::ExternalSigner,std::default_delete<interfaces::ExternalSigner>>*,std::allocator<std::unique_ptr<interfaces::ExternalSigner,std::default_delete<interfaces::ExternalSigner>>>>
                           (puVar4,__last,puVar3 + 1,
                            (allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>
                             *)__return_storage_ptr__);
        pEVar6 = pEVar7;
        std::
        _Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
        ::_M_deallocate(&__return_storage_ptr__->
                         super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                        ,__first,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)__first >> 3);
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = __result;
        (__return_storage_ptr__->
        super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + __n;
        pEVar7 = pEVar6;
      }
      else {
        (puVar4->_M_t).
        super___uniq_ptr_impl<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>
        ._M_t.
        super__Tuple_impl<0UL,_interfaces::ExternalSigner_*,_std::default_delete<interfaces::ExternalSigner>_>
        .super__Head_base<0UL,_interfaces::ExternalSigner_*,_false>._M_head_impl = pEVar2;
        puVar4 = puVar4 + 1;
      }
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>,_std::allocator<std::unique_ptr<interfaces::ExternalSigner,_std::default_delete<interfaces::ExternalSigner>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = puVar4;
    }
  }
  std::__cxx11::string::~string((string *)&command);
  std::vector<ExternalSigner,_std::allocator<ExternalSigner>_>::~vector(&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<interfaces::ExternalSigner>> listExternalSigners() override
    {
#ifdef ENABLE_EXTERNAL_SIGNER
        std::vector<ExternalSigner> signers = {};
        const std::string command = args().GetArg("-signer", "");
        if (command == "") return {};
        ExternalSigner::Enumerate(command, signers, Params().GetChainTypeString());
        std::vector<std::unique_ptr<interfaces::ExternalSigner>> result;
        result.reserve(signers.size());
        for (auto& signer : signers) {
            result.emplace_back(std::make_unique<ExternalSignerImpl>(std::move(signer)));
        }
        return result;
#else
        // This result is indistinguishable from a successful call that returns
        // no signers. For the current GUI this doesn't matter, because the wallet
        // creation dialog disables the external signer checkbox in both
        // cases. The return type could be changed to std::optional<std::vector>
        // (or something that also includes error messages) if this distinction
        // becomes important.
        return {};
#endif // ENABLE_EXTERNAL_SIGNER
    }